

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimdUint8x16OperationX86X64.cpp
# Opt level: O1

SIMDValue Js::SIMDUint8x16Operation::OpUint8x16(uint8 *values)

{
  return (SIMDValue)*(anon_union_16_9_4d7543c8_for__SIMDValue_0 *)values;
}

Assistant:

SIMDValue SIMDUint8x16Operation::OpUint8x16(uint8 values[])
    {
        X86SIMDValue x86Result;
        // Sets the 16 signed 8-bit integer values, note in revised order: starts with x15 below
        x86Result.m128i_value = _mm_set_epi8((int8)values[15], (int8)values[14], (int8)values[13], (int8)values[12],
                                             (int8)values[11], (int8)values[10], (int8)values[9], (int8)values[8],
                                             (int8)values[7], (int8)values[6], (int8)values[5], (int8)values[4],
                                             (int8)values[3], (int8)values[2], (int8)values[1], (int8)values[0]);

        return X86SIMDValue::ToSIMDValue(x86Result);
    }